

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true>
duckdb::AtClause::Deserialize(Deserializer *deserializer)

{
  AtClause *this;
  unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> in_RDI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unit;
  unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *result;
  pointer in_stack_ffffffffffffff58;
  string *this_00;
  string *unit_p;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  field_id_t in_stack_ffffffffffffff96;
  Deserializer *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  field_id_t in_stack_ffffffffffffffb6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_30 [48];
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            ((Deserializer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb6,(char *)in_stack_ffffffffffffffa8);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff96,
             (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  this = (AtClause *)operator_new(0x28);
  this_00 = (string *)&stack0xffffffffffffff98;
  ::std::__cxx11::string::string(this_00,local_30);
  unit_p = (string *)&stack0xffffffffffffff90;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffff58);
  AtClause(this,unit_p,
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)this_00);
  unique_ptr<duckdb::AtClause,std::default_delete<duckdb::AtClause>,true>::
  unique_ptr<std::default_delete<duckdb::AtClause>,void>
            ((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)this_00,
             in_stack_ffffffffffffff58);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0xae9ac9);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0xae9b4c);
  ::std::__cxx11::string::~string(local_30);
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (__uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         in_RDI._M_t.super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>
         ._M_t.super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AtClause> AtClause::Deserialize(Deserializer &deserializer) {
	auto unit = deserializer.ReadPropertyWithDefault<string>(1, "unit");
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(2, "expr");
	auto result = duckdb::unique_ptr<AtClause>(new AtClause(std::move(unit), std::move(expr)));
	return result;
}